

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNSwap.h
# Opt level: O1

void __thiscall NaPNSwapper::~NaPNSwapper(NaPNSwapper *this)

{
  (this->super_NaPetriNode)._vptr_NaPetriNode = (_func_int **)&PTR__NaPNSwapper_00175ad8;
  NaPetriCnOutput::~NaPetriCnOutput(&this->out2);
  NaPetriCnOutput::~NaPetriCnOutput(&this->out);
  NaPetriCnInput::~NaPetriCnInput(&this->in2);
  NaPetriCnInput::~NaPetriCnInput(&this->in);
  NaPetriCnInput::~NaPetriCnInput(&this->turn);
  NaPetriNode::~NaPetriNode(&this->super_NaPetriNode);
  operator_delete(this,0x220);
  return;
}

Assistant:

class PNNA_API NaPNSwapper : public NaPetriNode
{
public:

    // Create node for Petri network
    NaPNSwapper (const char* szNodeName = "swapper");


    ////////////////
    // Connectors //
    ////////////////

    // Control input
    NaPetriCnInput      turn;

    // Input (mainstream)
    NaPetriCnInput      in;

    // Another input
    NaPetriCnInput      in2;

    // Output (mainstream)
    NaPetriCnOutput     out;

    // Another output
    NaPetriCnOutput     out2;


    ///////////////////
    // Quick linkage //
    ///////////////////

    // Return mainstream input connector (the only input or NULL)
    virtual NaPetriConnector*   main_input_cn ();

    // Return mainstream output connector (the only output or NULL)
    virtual NaPetriConnector*   main_output_cn ();


    ///////////////////////
    // Phases of network //
    ///////////////////////

    // 2. Link connectors inside the node
    virtual void        relate_connectors ();

    // 5. Verification to be sure all is OK (true)
    virtual bool        verify ();

    // 7. Do one step of node activity and return true if succeeded
    virtual bool        activate ();

    // 8. True action of the node (if activate returned true)
    virtual void        action ();

    // 9. Finish data processing by the node (if activate returned true)
    virtual void        post_action ();

}